

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTarget *this,string *config,string *language)

{
  cmMakefile *pcVar1;
  auto_ptr<cmCompiledGeneratorExpression> aVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  LinkImplementation *pLVar7;
  pointer in_relative;
  cmTargetInternals *this_00;
  bool debugIncludes;
  string libDir;
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression local_170;
  string *local_168;
  auto_ptr<cmCompiledGeneratorExpression> local_160;
  cmGeneratorExpression ge;
  undefined1 local_148;
  undefined7 uStack_147;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = language;
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hashtable(&uniqueIncludes._M_ht,100,
              (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dagChecker,
              (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&libDir,(allocator_type *)&ge);
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,"INCLUDE_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&this->Name,&libDir,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = this->Makefile;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&libDir,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  __s = cmMakefile::GetDefinition(pcVar1,&libDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,__s,__s + sVar5);
    cmSystemTools::ExpandListArgument(&libDir,&debugProperties,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)libDir._M_dataplus._M_p != &libDir.field_2) {
      operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->DebugIncludesDone == false) {
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    debugIncludes =
         _Var6._M_current !=
         debugProperties.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugIncludes = false;
  }
  if (this->Makefile->Configured == true) {
    this->DebugIncludesDone = true;
  }
  processIncludeDirectories
            (this,&((this->Internal).Pointer)->IncludeDirectoriesEntries,__return_storage_ptr__,
             &uniqueIncludes,&dagChecker,config,debugIncludes,local_168);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (cmTargetInternals *)&libDir;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this_00,"INTERFACE_INCLUDE_DIRECTORIES","");
  cmTargetInternals::AddInterfaceEntries
            (this_00,this,config,&libDir,&linkInterfaceIncludeDirectoriesEntries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = this->Makefile;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,"APPLE","");
  bVar3 = cmMakefile::IsOn(pcVar1,&libDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pLVar7 = GetLinkImplementation(this,config);
    in_relative = (pLVar7->super_LinkImplementationLibraries).Libraries.
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (in_relative !=
        (pLVar7->super_LinkImplementationLibraries).Libraries.
        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        cmsys::SystemTools::CollapseFullPath(&libDir,(string *)in_relative);
        if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
             frameworkCheck == '\0') &&
           (iVar4 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::frameworkCheck), iVar4 != 0)) {
          GetIncludeDirectories::frameworkCheck.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
        bVar3 = cmsys::RegularExpression::find
                          (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
        if (bVar3) {
          if (GetIncludeDirectories::frameworkCheck.startp[1] == (char *)0x0) {
            ge.Backtrace = (cmListFileBacktrace *)&stack0xfffffffffffffeb8;
            local_148 = 0;
          }
          else {
            ge.Backtrace = (cmListFileBacktrace *)&stack0xfffffffffffffeb8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&ge,GetIncludeDirectories::frameworkCheck.startp[1],
                       GetIncludeDirectories::frameworkCheck.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&libDir,(string *)&ge);
          if (ge.Backtrace != (cmListFileBacktrace *)&stack0xfffffffffffffeb8) {
            operator_delete(ge.Backtrace,CONCAT71(uStack_147,local_148) + 1);
          }
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
          cmGeneratorExpression::Parse(&local_170,(char *)&ge);
          cge.x_ = (cmCompiledGeneratorExpression *)local_170.Backtrace;
          local_170.Backtrace = (cmListFileBacktrace *)0x0;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_170);
          local_170.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
          aVar2 = cge;
          cge.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_160.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((cmCompiledGeneratorExpression *)local_170.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)aVar2.x_;
          (((cmCompiledGeneratorExpression *)local_170.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
          if (linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
            ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                      ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                        *)&linkInterfaceIncludeDirectoriesEntries,
                       (iterator)
                       linkInterfaceIncludeDirectoriesEntries.
                       super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(TargetPropertyEntry **)&local_170
                      );
          }
          else {
            *linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (TargetPropertyEntry *)local_170.Backtrace
            ;
            linkInterfaceIncludeDirectoriesEntries.
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 linkInterfaceIncludeDirectoriesEntries.
                 super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_160);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
          cmGeneratorExpression::~cmGeneratorExpression(&ge);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libDir._M_dataplus._M_p != &libDir.field_2) {
          operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
        }
        in_relative = in_relative + 1;
      } while (in_relative !=
               (pLVar7->super_LinkImplementationLibraries).Libraries.
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  processIncludeDirectories
            (this,&linkInterfaceIncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,local_168);
  std::
  for_each<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>,false>>
            (linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (linkInterfaceIncludeDirectoriesEntries.
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      linkInterfaceIncludeDirectoriesEntries.
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    linkInterfaceIncludeDirectoriesEntries.
    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         linkInterfaceIncludeDirectoriesEntries.
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (linkInterfaceIncludeDirectoriesEntries.
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(linkInterfaceIncludeDirectoriesEntries.
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&dagChecker.Backtrace.
              super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
    operator_delete(dagChecker.Target._M_dataplus._M_p,
                    dagChecker.Target.field_2._M_allocated_capacity + 1);
  }
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable(&uniqueIncludes._M_ht);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
cmTarget::GetIncludeDirectories(const std::string& config,
                                const std::string& language) const
{
  std::vector<std::string> includes;
  UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "INCLUDE_DIRECTORIES", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugIncludes = !this->DebugIncludesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "INCLUDE_DIRECTORIES")
                        != debugProperties.end();

  if (this->Makefile->IsConfigured())
    {
    this->DebugIncludesDone = true;
    }

  processIncludeDirectories(this,
                            this->Internal->IncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  std::vector<cmTargetInternals::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  this->Internal->AddInterfaceEntries(
    this, config, "INTERFACE_INCLUDE_DIRECTORIES",
    linkInterfaceIncludeDirectoriesEntries);

  if(this->Makefile->IsOn("APPLE"))
    {
    LinkImplementation const* impl = this->GetLinkImplementation(config);
    for(std::vector<cmLinkImplItem>::const_iterator
        it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression
        frameworkCheck("(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if(!frameworkCheck.find(libDir))
        {
        continue;
        }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries
              .push_back(new cmTargetInternals::TargetPropertyEntry(cge));
      }
    }

  processIncludeDirectories(this,
                            linkInterfaceIncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  deleteAndClear(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}